

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

StatisticObject __thiscall
Clasp::ClaspStatistics::findObject(ClaspStatistics *this,Key_t root,char *path,Key_t *res)

{
  Key_t *pKVar1;
  bool bVar2;
  StatisticObject SVar3;
  reference ppIVar4;
  char *pcVar5;
  E EVar6;
  ulong __n;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar7;
  char *top;
  char *local_468;
  StatisticObject local_460;
  int pos;
  ClaspStatistics *local_450;
  Key_t *local_448;
  uint64 local_440;
  char temp [1024];
  
  local_450 = this;
  SVar3 = Impl::get(this->impl_,root);
  local_460 = SVar3;
  if (SVar3.handle_ == 0) {
    EVar6 = Empty;
  }
  else {
    ppIVar4 = bk_lib::
              pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
              ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                    *)StatisticObject::types_s,(uint)(ushort)(SVar3.handle_ >> 0x30));
    EVar6 = ((*ppIVar4)->type).val_;
  }
  local_448 = res;
  if ((path != (char *)0x0) && (local_468 = path, *path != '\0')) {
    do {
      top = path;
      pcVar5 = strchr(path,0x2e);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        __n = (long)pcVar5 - (long)path;
        if (0x3ff < __n) {
          Potassco::fail(-1,
                         "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                         ,0x15c,"len < 1024","invalid key",0);
        }
        pcVar5 = pcVar5 + 1;
        memcpy(temp,path,__n);
        temp[__n] = '\0';
        path = temp;
        top = temp;
      }
      if (EVar6 == Array) {
        bVar2 = Potassco::match(&top,&pos);
        path = top;
        if ((!bVar2) || (pos < 0)) goto LAB_00174492;
        SVar3 = StatisticObject::operator[](&local_460,pos);
      }
      else {
        if (EVar6 != Map) {
LAB_00174492:
          Potassco::fail(0x22,
                         "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                         ,0x165,"false","invalid path: \'%s\' at key \'%s\'",local_468,path,0);
        }
        SVar3 = StatisticObject::at(&local_460,path);
      }
      local_460.handle_ = SVar3.handle_;
      if (SVar3.handle_ == 0) {
        EVar6 = Empty;
      }
      else {
        ppIVar4 = bk_lib::
                  pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                  ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                        *)StatisticObject::types_s,(uint)(ushort)(SVar3.handle_ >> 0x30));
        EVar6 = ((*ppIVar4)->type).val_;
      }
    } while ((pcVar5 != (char *)0x0) && (path = pcVar5, *pcVar5 != '\0'));
  }
  pKVar1 = local_448;
  if (local_448 != (Key_t *)0x0) {
    _pos = local_450->impl_;
    local_440 = SVar3.handle_;
    pVar7 = std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ();
    *pKVar1 = *(Key_t *)((long)pVar7.first.super__Node_iterator_base<unsigned_long,_false>._M_cur.
                               super__Node_iterator_base<unsigned_long,_false> + 8);
  }
  return (StatisticObject)SVar3.handle_;
}

Assistant:

StatisticObject ClaspStatistics::findObject(Key_t root, const char* path, Key_t* res) const {
	StatisticObject o = getObject(root);
	StatisticObject::Type t = o.type();
	char temp[1024]; const char* top, *parent = path;
	for (int pos; path && *path;) {
		top = path;
		if ((path = std::strchr(path, '.')) != 0) {
			std::size_t len = static_cast<std::size_t>(path++ - top);
			POTASSCO_ASSERT(len < 1024, "invalid key");
			top = (const char*)std::memcpy(temp, top, len);
			temp[len] = 0;
		}
		if      (t == Potassco::Statistics_t::Map) { o = o.at(top); }
		else if (t == Potassco::Statistics_t::Array && Potassco::match(top, pos) && pos >= 0) {
			o = o[uint32(pos)];
		}
		else {
			POTASSCO_CHECK(false, ERANGE, "invalid path: '%s' at key '%s'", parent, top);
		}
		t = o.type();
	}
	if (res) { *res = impl_->add(o); }
	return o;
}